

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void ly_ext_log(ly_ctx *ctx,char *plugin_name,LY_LOG_LEVEL level,LY_ERR err,char *data_path,
               char *schema_path,uint64_t line,char *format,__va_list_tag *ap)

{
  int iVar1;
  char *plugin_msg;
  
  if (level <= ly_ll) {
    iVar1 = asprintf(&plugin_msg,"Ext plugin \"%s\": %s",plugin_name,format);
    if (iVar1 == -1) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_ext_log");
    }
    else {
      log_vprintf(ctx,level,(uint)(level == LY_LLERR) << 7 | err,LYVE_OTHER,data_path,schema_path,
                  line,(char *)0x0,plugin_msg,ap);
      free(plugin_msg);
    }
  }
  return;
}

Assistant:

static void
ly_ext_log(const struct ly_ctx *ctx, const char *plugin_name, LY_LOG_LEVEL level, LY_ERR err, char *data_path,
        char *schema_path, uint64_t line, const char *format, va_list ap)
{
    char *plugin_msg;

    if (ATOMIC_LOAD_RELAXED(ly_ll) < level) {
        return;
    }
    if (asprintf(&plugin_msg, "Ext plugin \"%s\": %s", plugin_name, format) == -1) {
        LOGMEM(ctx);
        return;
    }

    log_vprintf(ctx, level, (level == LY_LLERR ? LY_EPLUGIN : 0) | err, LYVE_OTHER, data_path, schema_path, line, NULL,
            plugin_msg, ap);
    free(plugin_msg);
}